

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_server.c
# Opt level: O0

void finish_request_line(cio_http_client *client)

{
  cio_error cVar1;
  cio_error err;
  cio_http_client *client_local;
  
  client->http_major = (client->parser).http_major;
  client->http_minor = (client->parser).http_minor;
  (client->http_private).finish_func = finish_header_line;
  cVar1 = cio_buffered_stream_read_until(&client->buffered_stream,&client->rb,"\r\n",parse,client);
  if (cVar1 != CIO_SUCCESS) {
    handle_server_error(client,"Reading of header line failed");
  }
  return;
}

Assistant:

static void finish_request_line(struct cio_http_client *client)
{
	client->http_major = client->parser.http_major;
	client->http_minor = client->parser.http_minor;
	client->http_private.finish_func = finish_header_line;
	enum cio_error err = cio_buffered_stream_read_until(&client->buffered_stream, &client->rb, CIO_CRLF, parse, client);
	if (cio_unlikely(err != CIO_SUCCESS)) {
		handle_server_error(client, "Reading of header line failed");
	}
}